

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_ldm.c
# Opt level: O2

size_t ZSTD_ldm_generateSequences
                 (ldmState_t *ldmState,rawSeqStore_t *sequences,ldmParams_t *params,void *src,
                 size_t srcSize)

{
  BYTE **ppBVar1;
  U32 *pUVar2;
  byte bVar3;
  rawSeq *prVar4;
  ldmState_t *plVar5;
  uint uVar6;
  XXH64_hash_t XVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  byte bVar11;
  uint uVar12;
  U32 UVar13;
  BYTE *pBVar14;
  ulong uVar15;
  uint uVar16;
  BYTE *pBVar17;
  ldmEntry_t *plVar18;
  ldmEntry_t *plVar19;
  long lVar20;
  BYTE *pBVar21;
  U32 UVar22;
  BYTE *pBVar23;
  uint uVar24;
  long lVar25;
  uint uVar26;
  ulong uVar27;
  long lVar28;
  ulong uVar29;
  BYTE *pBVar30;
  ldmParams_t *plVar31;
  BYTE *pBVar32;
  ldmEntry_t **pplVar33;
  uint local_194;
  uint local_174;
  BYTE *local_170;
  BYTE *local_168;
  size_t local_160;
  ldmParams_t *local_158;
  BYTE *local_150;
  BYTE *local_148;
  ldmState_t *local_140;
  BYTE *local_138;
  ldmEntry_t *local_130;
  BYTE *local_128;
  ulong local_120;
  ulong local_118;
  uint local_10c;
  ulong local_108;
  ulong local_100;
  ulong local_f8;
  ldmMatchCandidate_t *local_f0;
  size_t local_e8;
  size_t local_e0;
  ulong local_d8;
  BYTE *local_d0;
  ldmEntry_t *local_c8;
  ulong local_c0;
  ulong local_b8;
  long local_b0;
  long local_a8;
  ulong local_a0;
  BYTE *local_98;
  void *local_90;
  size_t local_88;
  BYTE *local_80;
  ldmEntry_t **local_78;
  size_t *local_70;
  long local_68;
  BYTE *local_60;
  long local_58;
  ulong local_50;
  ulong local_48;
  ldmRollingHashState_t hashState;
  
  uVar26 = 1 << ((byte)params->windowLog & 0x1f);
  local_108 = (ulong)uVar26;
  local_98 = (BYTE *)((long)src + srcSize);
  lVar28 = ((srcSize >> 0x14) + 1) - (ulong)((srcSize & 0xfffff) == 0);
  local_90 = src;
  local_88 = srcSize;
  if ((ldmState->window).nextSrc < local_98) {
    __assert_fail("ldmState->window.nextSrc >= (BYTE const*)src + srcSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_ldm.c"
                  ,0x209,
                  "size_t ZSTD_ldm_generateSequences(ldmState_t *, rawSeqStore_t *, const ldmParams_t *, const void *, size_t)"
                 );
  }
  uVar29 = sequences->size;
  if (uVar29 < sequences->pos) {
    __assert_fail("sequences->pos <= sequences->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_ldm.c"
                  ,0x20d,
                  "size_t ZSTD_ldm_generateSequences(ldmState_t *, rawSeqStore_t *, const ldmParams_t *, const void *, size_t)"
                 );
  }
  if (sequences->capacity < uVar29) {
    __assert_fail("sequences->size <= sequences->capacity",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_ldm.c"
                  ,0x20e,
                  "size_t ZSTD_ldm_generateSequences(ldmState_t *, rawSeqStore_t *, const ldmParams_t *, const void *, size_t)"
                 );
  }
  uVar26 = uVar26 + 2;
  local_70 = ldmState->splitIndices;
  local_f0 = ldmState->matchCandidates;
  local_78 = &ldmState->matchCandidates[0].bucket;
  uVar15 = 0;
  lVar25 = 0;
  local_158 = params;
  local_140 = ldmState;
  local_b0 = lVar28;
  do {
    plVar31 = local_158;
    if ((lVar25 == lVar28) || (sequences->capacity <= uVar29)) {
      return 0;
    }
    pBVar14 = (BYTE *)((long)local_90 + lVar25 * 0x100000);
    pBVar23 = pBVar14 + 0x100000;
    if (local_88 + lVar25 * -0x100000 < 0x100000) {
      pBVar23 = local_98;
    }
    local_100 = uVar15;
    if ((long)local_88 <= lVar25 * 0x100000) {
      __assert_fail("chunkStart < iend",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_ldm.c"
                    ,0x218,
                    "size_t ZSTD_ldm_generateSequences(ldmState_t *, rawSeqStore_t *, const ldmParams_t *, const void *, size_t)"
                   );
    }
    pBVar21 = (ldmState->window).base;
    uVar6 = (int)pBVar23 - (int)pBVar21;
    local_f8 = uVar29;
    if (uVar6 < 0xe0000001) {
      UVar13 = ldmState->loadedDictEnd;
    }
    else {
      UVar13 = params->hashLog;
      uVar6 = (int)pBVar14 - (int)pBVar21;
      uVar12 = uVar6 - uVar26;
      if (uVar6 < uVar26 || uVar12 == 0) {
        __assert_fail("curr > newCurrent",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x448,
                      "U32 ZSTD_window_correctOverflow(ZSTD_window_t *, U32, U32, const void *)");
      }
      if (uVar12 < 0x10000001) {
        __assert_fail("correction > 1<<28",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,1099,
                      "U32 ZSTD_window_correctOverflow(ZSTD_window_t *, U32, U32, const void *)");
      }
      (ldmState->window).base = pBVar21 + uVar12;
      ppBVar1 = &(ldmState->window).dictBase;
      *ppBVar1 = *ppBVar1 + uVar12;
      uVar6 = (ldmState->window).dictLimit;
      uVar16 = (ldmState->window).lowLimit;
      uVar24 = uVar16 - uVar12;
      if (uVar16 < uVar12 + 2) {
        uVar24 = 2;
      }
      (ldmState->window).lowLimit = uVar24;
      uVar16 = uVar6 - uVar12;
      if (uVar6 < uVar12 + 2) {
        uVar16 = 2;
      }
      (ldmState->window).dictLimit = uVar16;
      if (uVar26 < uVar24) {
        __assert_fail("window->lowLimit <= newCurrent",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x45f,
                      "U32 ZSTD_window_correctOverflow(ZSTD_window_t *, U32, U32, const void *)");
      }
      if (uVar26 < uVar16) {
        __assert_fail("window->dictLimit <= newCurrent",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x460,
                      "U32 ZSTD_window_correctOverflow(ZSTD_window_t *, U32, U32, const void *)");
      }
      pUVar2 = &(ldmState->window).nbOverflowCorrections;
      *pUVar2 = *pUVar2 + 1;
      plVar19 = ldmState->hashTable;
      for (lVar20 = 0; 1L << ((byte)UVar13 & 0x3f) != lVar20; lVar20 = lVar20 + 1) {
        uVar6 = plVar19[lVar20].offset;
        UVar22 = uVar6 - uVar12;
        if (uVar6 < uVar12) {
          UVar22 = 0;
        }
        plVar19[lVar20].offset = UVar22;
      }
      ldmState->loadedDictEnd = 0;
      pBVar21 = (ldmState->window).base;
      uVar6 = (int)pBVar23 - (int)pBVar21;
      UVar13 = 0;
    }
    if (UVar13 + (int)local_108 < uVar6) {
      uVar6 = uVar6 - (int)local_108;
      uVar12 = (ldmState->window).lowLimit;
      if (uVar12 < uVar6) {
        (ldmState->window).lowLimit = uVar6;
        uVar12 = uVar6;
      }
      uVar6 = (ldmState->window).dictLimit;
      if (uVar6 < uVar12) {
        (ldmState->window).dictLimit = uVar12;
        uVar6 = uVar12;
      }
      ldmState->loadedDictEnd = 0;
    }
    else {
      uVar6 = (ldmState->window).dictLimit;
      uVar12 = (ldmState->window).lowLimit;
    }
    bVar11 = (byte)params->bucketSizeLog;
    local_58 = 1L << (bVar11 & 0x3f);
    UVar13 = params->hashLog;
    uVar27 = (ulong)params->minMatchLength;
    if (uVar12 < uVar6) {
      local_148 = (ldmState->window).dictBase;
      local_194 = uVar12;
    }
    else {
      local_148 = (BYTE *)0x0;
      local_194 = uVar6;
    }
    local_a0 = (long)pBVar23 - (long)pBVar14;
    uVar15 = local_a0;
    params = local_158;
    if (uVar27 <= local_a0) {
      local_128 = local_148 + local_194;
      local_d0 = local_148 + uVar6;
      local_138 = pBVar21 + uVar6;
      local_168 = pBVar14 + local_a0;
      lVar28 = local_a0 - 8;
      local_170 = pBVar21;
      local_a8 = lVar25;
      ZSTD_ldm_gear_init(&hashState,local_158);
      local_68 = -uVar27;
      local_10c = ~(-1 << ((char)UVar13 - bVar11 & 0x1f));
      local_118 = uVar27;
      local_80 = pBVar14 + lVar28;
      for (pBVar21 = pBVar14 + uVar27; pBVar21 < local_80; pBVar21 = pBVar21 + local_160) {
        local_174 = 0;
        local_150 = pBVar21;
        local_160 = ZSTD_ldm_gear_feed(&hashState,pBVar21,(long)local_80 - (long)pBVar21,local_70,
                                       &local_174);
        lVar28 = local_68;
        pBVar21 = local_150;
        local_c0 = (ulong)local_174;
        pplVar33 = local_78;
        for (uVar29 = 0; plVar5 = local_140, local_c0 != uVar29; uVar29 = uVar29 + 1) {
          sVar8 = local_140->splitIndices[uVar29];
          XVar7 = ZSTD_XXH64(pBVar21 + sVar8 + lVar28,local_118,0);
          uVar16 = (uint)XVar7 & local_10c;
          ((ldmMatchCandidate_t *)(pplVar33 + -2))->split = pBVar21 + sVar8 + lVar28;
          *(uint *)(pplVar33 + -1) = uVar16;
          *(U32 *)((long)pplVar33 + -4) = (U32)(XVar7 >> 0x20);
          *pplVar33 = plVar5->hashTable + ((ulong)uVar16 << ((byte)plVar31->bucketSizeLog & 0x3f));
          pplVar33 = pplVar33 + 3;
        }
        local_60 = local_150 + local_160;
        ldmState = local_140;
        pBVar17 = local_170;
        for (uVar29 = 0; pBVar21 = local_150, uVar29 != local_c0; uVar29 = uVar29 + 1) {
          pBVar21 = local_f0[uVar29].split;
          uVar15 = (ulong)local_f0[uVar29].checksum;
          local_d8 = (long)pBVar21 - (long)pBVar17;
          uVar27 = (ulong)local_f0[uVar29].hash;
          if (pBVar21 < pBVar14) {
LAB_0061202b:
            bVar11 = (byte)plVar31->bucketSizeLog;
            pBVar21 = ldmState->bucketOffsets;
            bVar3 = pBVar21[uVar27];
            ldmState->hashTable[(uVar27 << (bVar11 & 0x3f)) + (ulong)bVar3] =
                 (ldmEntry_t)(local_d8 & 0xffffffff | uVar15 << 0x20);
            pBVar21[uVar27] = ~(byte)(-1 << (bVar11 & 0x1f)) & bVar3 + 1;
          }
          else {
            plVar19 = local_f0[uVar29].bucket;
            plVar18 = plVar19 + local_58;
            local_130 = (ldmEntry_t *)0x0;
            local_b8 = 0;
            local_e8 = 0;
            local_e0 = 0;
            local_120 = uVar15;
            local_c8 = plVar18;
            local_50 = (ulong)local_f0[uVar29].hash;
            local_48 = uVar29;
            for (; plVar19 < plVar18; plVar19 = plVar19 + 1) {
              if (plVar19->checksum == (U32)uVar15) {
                uVar16 = plVar19->offset;
                if (local_194 < uVar16) {
                  if (uVar12 < uVar6) {
                    pBVar30 = local_148;
                    pBVar32 = local_d0;
                    if (uVar6 <= uVar16) {
                      pBVar30 = pBVar17;
                      pBVar32 = local_168;
                    }
                    pBVar30 = pBVar30 + uVar16;
                    pBVar17 = pBVar21 + ((long)pBVar32 - (long)pBVar30);
                    if (pBVar23 <= pBVar21 + ((long)pBVar32 - (long)pBVar30)) {
                      pBVar17 = local_168;
                    }
                    sVar8 = ZSTD_count(pBVar21,pBVar30,pBVar17);
                    if (pBVar30 + sVar8 == pBVar32) {
                      sVar9 = ZSTD_count(pBVar21 + sVar8,local_138,local_168);
                      sVar8 = sVar8 + sVar9;
                    }
                    uVar15 = local_120;
                    pBVar17 = local_170;
                    if (local_118 <= sVar8) {
                      pBVar17 = local_128;
                      if (uVar6 <= uVar16) {
                        pBVar17 = local_138;
                      }
                      sVar9 = ZSTD_ldm_countBackwardsMatch(pBVar21,pBVar14,pBVar30,pBVar17);
                      if ((pBVar17 != local_128) && (pBVar30 + -sVar9 == pBVar17)) {
                        sVar10 = ZSTD_ldm_countBackwardsMatch
                                           (pBVar21 + -sVar9,pBVar14,local_d0,local_128);
                        sVar9 = sVar9 + sVar10;
                      }
LAB_00611f05:
                      uVar15 = local_120;
                      pBVar17 = local_170;
                      if (local_b8 < sVar9 + sVar8) {
                        local_130 = plVar19;
                        local_e8 = sVar9;
                        local_e0 = sVar8;
                        local_b8 = sVar9 + sVar8;
                      }
                    }
                  }
                  else {
                    pBVar30 = pBVar17 + uVar16;
                    sVar8 = ZSTD_count(pBVar21,pBVar30,local_168);
                    uVar15 = local_120;
                    plVar18 = local_c8;
                    pBVar17 = local_170;
                    if (local_118 <= sVar8) {
                      sVar9 = ZSTD_ldm_countBackwardsMatch(pBVar21,pBVar14,pBVar30,local_138);
                      plVar18 = local_c8;
                      goto LAB_00611f05;
                    }
                  }
                }
              }
            }
            ldmState = local_140;
            uVar29 = local_48;
            uVar27 = local_50;
            plVar31 = local_158;
            if (local_130 == (ldmEntry_t *)0x0) goto LAB_0061202b;
            sVar8 = sequences->size;
            if (sVar8 == sequences->capacity) {
              return 0xffffffffffffffba;
            }
            prVar4 = sequences->seq;
            UVar13 = local_130->offset;
            prVar4[sVar8].litLength = ((int)pBVar21 - (int)local_e8) - (int)pBVar14;
            prVar4[sVar8].matchLength = (int)local_e0 + (int)local_e8;
            prVar4[sVar8].offset = (int)local_d8 - UVar13;
            sequences->size = sVar8 + 1;
            bVar11 = (byte)local_158->bucketSizeLog;
            pBVar14 = local_140->bucketOffsets;
            bVar3 = pBVar14[local_50];
            local_140->hashTable[(local_50 << (bVar11 & 0x3f)) + (ulong)bVar3] =
                 (ldmEntry_t)(local_d8 & 0xffffffff | uVar15 << 0x20);
            pBVar14[local_50] = ~(byte)(-1 << (bVar11 & 0x1f)) & bVar3 + 1;
            pBVar14 = pBVar21 + local_e0;
            if (local_60 < pBVar14) {
              pBVar21 = pBVar14 + -local_160;
              break;
            }
          }
        }
      }
      uVar15 = (long)pBVar23 - (long)pBVar14;
      if (0xffffffffffffff88 < uVar15) {
        return uVar15;
      }
      uVar29 = sequences->size;
      lVar25 = local_a8;
      lVar28 = local_b0;
      params = plVar31;
    }
    if (local_f8 < uVar29) {
      pUVar2 = &sequences->seq[local_f8].litLength;
      *pUVar2 = *pUVar2 + (int)local_100;
    }
    else {
      if (uVar15 != local_a0) {
        __assert_fail("newLeftoverSize == chunkSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_ldm.c"
                      ,0x23f,
                      "size_t ZSTD_ldm_generateSequences(ldmState_t *, rawSeqStore_t *, const ldmParams_t *, const void *, size_t)"
                     );
      }
      uVar15 = local_a0 + local_100;
    }
    lVar25 = lVar25 + 1;
  } while( true );
}

Assistant:

size_t ZSTD_ldm_generateSequences(
        ldmState_t* ldmState, rawSeqStore_t* sequences,
        ldmParams_t const* params, void const* src, size_t srcSize)
{
    U32 const maxDist = 1U << params->windowLog;
    BYTE const* const istart = (BYTE const*)src;
    BYTE const* const iend = istart + srcSize;
    size_t const kMaxChunkSize = 1 << 20;
    size_t const nbChunks = (srcSize / kMaxChunkSize) + ((srcSize % kMaxChunkSize) != 0);
    size_t chunk;
    size_t leftoverSize = 0;

    assert(ZSTD_CHUNKSIZE_MAX >= kMaxChunkSize);
    /* Check that ZSTD_window_update() has been called for this chunk prior
     * to passing it to this function.
     */
    assert(ldmState->window.nextSrc >= (BYTE const*)src + srcSize);
    /* The input could be very large (in zstdmt), so it must be broken up into
     * chunks to enforce the maximum distance and handle overflow correction.
     */
    assert(sequences->pos <= sequences->size);
    assert(sequences->size <= sequences->capacity);
    for (chunk = 0; chunk < nbChunks && sequences->size < sequences->capacity; ++chunk) {
        BYTE const* const chunkStart = istart + chunk * kMaxChunkSize;
        size_t const remaining = (size_t)(iend - chunkStart);
        BYTE const *const chunkEnd =
            (remaining < kMaxChunkSize) ? iend : chunkStart + kMaxChunkSize;
        size_t const chunkSize = chunkEnd - chunkStart;
        size_t newLeftoverSize;
        size_t const prevSize = sequences->size;

        assert(chunkStart < iend);
        /* 1. Perform overflow correction if necessary. */
        if (ZSTD_window_needOverflowCorrection(ldmState->window, 0, maxDist, ldmState->loadedDictEnd, chunkStart, chunkEnd)) {
            U32 const ldmHSize = 1U << params->hashLog;
            U32 const correction = ZSTD_window_correctOverflow(
                &ldmState->window, /* cycleLog */ 0, maxDist, chunkStart);
            ZSTD_ldm_reduceTable(ldmState->hashTable, ldmHSize, correction);
            /* invalidate dictionaries on overflow correction */
            ldmState->loadedDictEnd = 0;
        }
        /* 2. We enforce the maximum offset allowed.
         *
         * kMaxChunkSize should be small enough that we don't lose too much of
         * the window through early invalidation.
         * TODO: * Test the chunk size.
         *       * Try invalidation after the sequence generation and test the
         *         offset against maxDist directly.
         *
         * NOTE: Because of dictionaries + sequence splitting we MUST make sure
         * that any offset used is valid at the END of the sequence, since it may
         * be split into two sequences. This condition holds when using
         * ZSTD_window_enforceMaxDist(), but if we move to checking offsets
         * against maxDist directly, we'll have to carefully handle that case.
         */
        ZSTD_window_enforceMaxDist(&ldmState->window, chunkEnd, maxDist, &ldmState->loadedDictEnd, NULL);
        /* 3. Generate the sequences for the chunk, and get newLeftoverSize. */
        newLeftoverSize = ZSTD_ldm_generateSequences_internal(
            ldmState, sequences, params, chunkStart, chunkSize);
        if (ZSTD_isError(newLeftoverSize))
            return newLeftoverSize;
        /* 4. We add the leftover literals from previous iterations to the first
         *    newly generated sequence, or add the `newLeftoverSize` if none are
         *    generated.
         */
        /* Prepend the leftover literals from the last call */
        if (prevSize < sequences->size) {
            sequences->seq[prevSize].litLength += (U32)leftoverSize;
            leftoverSize = newLeftoverSize;
        } else {
            assert(newLeftoverSize == chunkSize);
            leftoverSize += chunkSize;
        }
    }
    return 0;
}